

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int32 ma_pcm_rb_pointer_distance(ma_pcm_rb *pRB)

{
  int iVar1;
  ma_uint32 mVar2;
  long in_RDI;
  undefined4 local_14;
  
  if (in_RDI == 0) {
    local_14 = 0;
  }
  else {
    local_14 = ma_rb_pointer_distance((ma_rb *)(in_RDI + 0x48));
    iVar1 = *(int *)(in_RDI + 0x8c);
    mVar2 = ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x88));
    local_14 = local_14 / (mVar2 * iVar1);
  }
  return local_14;
}

Assistant:

MA_API ma_int32 ma_pcm_rb_pointer_distance(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return ma_rb_pointer_distance(&pRB->rb) / ma_pcm_rb_get_bpf(pRB);
}